

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

unsigned_long __thiscall acto::core::runtime_t::release(runtime_t *this,object_t *obj)

{
  __int_type_conflict _Var1;
  long result;
  object_t *obj_local;
  runtime_t *this_local;
  
  if (obj == (object_t *)0x0) {
    __assert_fail("obj",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0xe4,"unsigned long acto::core::runtime_t::release(object_t *const)");
  }
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&obj->references);
  if (_Var1 != 0) {
    _Var1 = std::__atomic_base<unsigned_long>::operator--
                      (&(obj->references).super___atomic_base<unsigned_long>);
    if (_Var1 == 0) {
      deconstruct_object(this,obj);
    }
    return _Var1;
  }
  __assert_fail("obj->references",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                ,0xe5,"unsigned long acto::core::runtime_t::release(object_t *const)");
}

Assistant:

unsigned long runtime_t::release(object_t* const obj) {
  assert(obj);
  assert(obj->references);

  const long result = --obj->references;

  if (result == 0) {
    deconstruct_object(obj);
  }

  return result;
}